

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stackTest.cpp
# Opt level: O2

int main(void)

{
  undefined1 *this;
  ostream *poVar1;
  int i;
  int iVar2;
  undefined1 local_240 [8];
  stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  std_3;
  undefined1 local_1e8 [8];
  stack<char,_ft::deque<char,_ft::allocator<char>_>_> ft;
  stack<int,_std::deque<int,_std::allocator<int>_>_> std_2;
  stack<char,_std::deque<char,_std::allocator<char>_>_> std;
  undefined1 local_a8 [8];
  stack<int,_ft::deque<int,_ft::allocator<int>_>_> ft_2;
  
  ::std::stack<char,std::deque<char,std::allocator<char>>>::
  stack<std::deque<char,std::allocator<char>>,void>
            ((stack<char,_std::deque<char,_std::allocator<char>_>_> *)
             &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node);
  ::ft::deque<char,_ft::allocator<char>_>::deque
            ((deque<char,_ft::allocator<char>_> *)local_a8,(allocator_type *)&ft.c.field_0x70);
  ::ft::deque<char,_ft::allocator<char>_>::deque
            ((deque<char,_ft::allocator<char>_> *)local_1e8,
             (deque<char,_ft::allocator<char>_> *)local_a8);
  ::ft::deque<char,_ft::allocator<char>_>::~deque((deque<char,_ft::allocator<char>_> *)local_a8);
  if (std.c.super__Deque_base<char,_std::allocator<char>_>._M_impl.super__Deque_impl_data._M_start.
      _M_node ==
      (_Map_pointer)
      std.c.super__Deque_base<char,_std::allocator<char>_>._M_impl.super__Deque_impl_data.
      _M_map_size) {
    poVar1 = ::std::operator<<((ostream *)&::std::cout,"std is empty");
    ::std::endl<char,std::char_traits<char>>(poVar1);
  }
  if (ft.c.m_chunks == 0) {
    poVar1 = ::std::operator<<((ostream *)&::std::cout," ft is empty");
    ::std::endl<char,std::char_traits<char>>(poVar1);
  }
  poVar1 = ::std::operator<<((ostream *)&::std::cout,"size of std is: ");
  ::std::deque<char,_std::allocator<char>_>::size
            ((deque<char,_std::allocator<char>_> *)
             &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node);
  poVar1 = ::std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  ::std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = ::std::operator<<((ostream *)&::std::cout,"size of ft  is: ");
  poVar1 = ::std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  ::std::endl<char,std::char_traits<char>>(poVar1);
  ::ft::deque<char,_ft::allocator<char>_>::~deque((deque<char,_ft::allocator<char>_> *)local_1e8);
  ::std::_Deque_base<char,_std::allocator<char>_>::~_Deque_base
            ((_Deque_base<char,_std::allocator<char>_> *)
             &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node);
  poVar1 = ::std::operator<<((ostream *)&::std::cout,"---");
  ::std::endl<char,std::char_traits<char>>(poVar1);
  ::std::stack<double,std::deque<double,std::allocator<double>>>::
  stack<std::deque<double,std::allocator<double>>,void>
            ((stack<double,_std::deque<double,_std::allocator<double>_>_> *)
             &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node);
  ::ft::deque<double,_ft::allocator<double>_>::deque
            ((deque<double,_ft::allocator<double>_> *)local_a8,(allocator_type *)&ft.c.field_0x70);
  ::ft::deque<double,_ft::allocator<double>_>::deque
            ((deque<double,_ft::allocator<double>_> *)local_1e8,
             (deque<double,_ft::allocator<double>_> *)local_a8);
  ::ft::deque<double,_ft::allocator<double>_>::~deque
            ((deque<double,_ft::allocator<double>_> *)local_a8);
  for (iVar2 = 1; iVar2 != 8; iVar2 = iVar2 + 1) {
    std_3.c.
    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)((double)iVar2 / 3.0);
    local_a8 = (undefined1  [8])
               std_3.c.
               super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node;
    ::std::deque<double,_std::allocator<double>_>::emplace_back<double>
              ((deque<double,_std::allocator<double>_> *)
               &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
                _M_finish._M_node,(double *)local_a8);
    local_a8 = (undefined1  [8])
               std_3.c.
               super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node;
    ::ft::deque<double,_ft::allocator<double>_>::push_back
              ((deque<double,_ft::allocator<double>_> *)local_1e8,(value_type_conflict1 *)local_a8);
  }
  poVar1 = ::std::operator<<((ostream *)&::std::cout,"size of std is: ");
  ::std::deque<double,_std::allocator<double>_>::size
            ((deque<double,_std::allocator<double>_> *)
             &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node);
  poVar1 = ::std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  ::std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = ::std::operator<<((ostream *)&::std::cout,"size of ft  is: ");
  poVar1 = ::std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  ::std::endl<char,std::char_traits<char>>(poVar1);
  print<std::stack<double,std::deque<double,std::allocator<double>>>>
            ((stack<double,_std::deque<double,_std::allocator<double>_>_> *)
             &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node,"std");
  print<ft::stack<double,ft::deque<double,ft::allocator<double>>>>
            ((stack<double,_ft::deque<double,_ft::allocator<double>_>_> *)local_1e8,"ft");
  ::ft::deque<double,_ft::allocator<double>_>::~deque
            ((deque<double,_ft::allocator<double>_> *)local_1e8);
  ::std::_Deque_base<double,_std::allocator<double>_>::~_Deque_base
            ((_Deque_base<double,_std::allocator<double>_> *)
             &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node);
  poVar1 = ::std::operator<<((ostream *)&::std::cout,"---");
  ::std::endl<char,std::char_traits<char>>(poVar1);
  ::std::stack<int,std::deque<int,std::allocator<int>>>::
  stack<std::deque<int,std::allocator<int>>,void>
            ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)
             &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node);
  ::ft::deque<int,_ft::allocator<int>_>::deque
            ((deque<int,_ft::allocator<int>_> *)local_a8,(allocator_type *)&ft.c.field_0x70);
  ::ft::deque<int,_ft::allocator<int>_>::deque
            ((deque<int,_ft::allocator<int>_> *)local_1e8,
             (deque<int,_ft::allocator<int>_> *)local_a8);
  ::ft::deque<int,_ft::allocator<int>_>::~deque((deque<int,_ft::allocator<int>_> *)local_a8);
  iVar2 = 1;
  while (local_a8._0_4_ = iVar2, iVar2 < 6) {
    ::std::deque<int,_std::allocator<int>_>::push_back
              ((deque<int,_std::allocator<int>_> *)
               &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
                _M_finish._M_node,(value_type *)local_a8);
    ::ft::deque<int,_ft::allocator<int>_>::push_back
              ((deque<int,_ft::allocator<int>_> *)local_1e8,(value_type *)local_a8);
    iVar2 = local_a8._0_4_ + 1;
  }
  ::std::deque<int,_std::allocator<int>_>::deque
            ((deque<int,_std::allocator<int>_> *)&ft.c.field_0x70,
             (deque<int,_std::allocator<int>_> *)
             &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node);
  ::ft::deque<int,_ft::allocator<int>_>::deque
            ((deque<int,_ft::allocator<int>_> *)local_a8,
             (deque<int,_ft::allocator<int>_> *)local_1e8);
  print<std::stack<int,std::deque<int,std::allocator<int>>>>
            ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)&ft.c.field_0x70,"std");
  print<ft::stack<int,ft::deque<int,ft::allocator<int>>>>
            ((stack<int,_ft::deque<int,_ft::allocator<int>_>_> *)local_a8,"ft");
  ::ft::deque<int,_ft::allocator<int>_>::~deque((deque<int,_ft::allocator<int>_> *)local_a8);
  ::std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            ((_Deque_base<int,_std::allocator<int>_> *)&ft.c.field_0x70);
  ::ft::deque<int,_ft::allocator<int>_>::~deque((deque<int,_ft::allocator<int>_> *)local_1e8);
  ::std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            ((_Deque_base<int,_std::allocator<int>_> *)
             &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node);
  poVar1 = ::std::operator<<((ostream *)&::std::cout,"---");
  ::std::endl<char,std::char_traits<char>>(poVar1);
  ::std::
  stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::stack<std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>,void>
            ((stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&ft.c.field_0x70);
  ::ft::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_a8,
          (allocator_type *)
          &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
           _M_finish._M_node);
  ::ft::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_1e8,
          (deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_a8);
  ::ft::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_a8);
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_a8,"what\'s",
             (allocator<char> *)
             &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node);
  ::std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&ft.c.field_0x70,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8);
  ::std::__cxx11::string::~string((string *)local_a8);
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_a8,"in",
             (allocator<char> *)
             &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node);
  ::std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&ft.c.field_0x70,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8);
  ::std::__cxx11::string::~string((string *)local_a8);
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_a8,"the",
             (allocator<char> *)
             &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node);
  ::std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&ft.c.field_0x70,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8);
  ::std::__cxx11::string::~string((string *)local_a8);
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_a8,"fucking",
             (allocator<char> *)
             &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node);
  ::std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&ft.c.field_0x70,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8);
  ::std::__cxx11::string::~string((string *)local_a8);
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_a8,"box",
             (allocator<char> *)
             &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node);
  ::std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&ft.c.field_0x70,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8);
  ::std::__cxx11::string::~string((string *)local_a8);
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_a8,"what\'s",
             (allocator<char> *)
             &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node);
  ::ft::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1e8,(value_type *)local_a8);
  ::std::__cxx11::string::~string((string *)local_a8);
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_a8,"in",
             (allocator<char> *)
             &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node);
  ::ft::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1e8,(value_type *)local_a8);
  ::std::__cxx11::string::~string((string *)local_a8);
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_a8,"the",
             (allocator<char> *)
             &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node);
  ::ft::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1e8,(value_type *)local_a8);
  ::std::__cxx11::string::~string((string *)local_a8);
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_a8,"fucking",
             (allocator<char> *)
             &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node);
  ::ft::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1e8,(value_type *)local_a8);
  ::std::__cxx11::string::~string((string *)local_a8);
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_a8,"box",
             (allocator<char> *)
             &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node);
  ::ft::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1e8,(value_type *)local_a8);
  ::std::__cxx11::string::~string((string *)local_a8);
  ::std::
  stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::stack<std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>,void>
            ((stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_240);
  ::ft::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node,(allocator_type *)&ft_2.c.field_0x77);
  ::ft::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_a8,
          (deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node);
  ::ft::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
               _M_finish._M_node);
  ::std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_240,
              (deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&ft.c.field_0x70);
  ::ft::
  stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator=((stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_a8,
              (stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_1e8);
  print<std::stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_240,"std");
  print<ft::stack<std::__cxx11::string,ft::deque<std::__cxx11::string,ft::allocator<std::__cxx11::string>>>>
            ((stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_a8,"ft");
  ::ft::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_a8);
  ::std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_240);
  ::ft::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_1e8);
  ::std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&ft.c.field_0x70);
  poVar1 = ::std::operator<<((ostream *)&::std::cout,"---");
  ::std::endl<char,std::char_traits<char>>(poVar1);
  local_1e8[0] = '~';
  ::std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)
             &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node,3,local_1e8,(allocator_type *)local_a8);
  local_a8[0] = 0x7e;
  ::ft::vector<char,_ft::allocator<char>_>::vector
            ((vector<char,_ft::allocator<char>_> *)local_1e8,3,local_a8,
             (allocator_type *)&ft.c.field_0x70);
  ::std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)&ft.c.field_0x70,
             (vector<char,_std::allocator<char>_> *)
             &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node);
  ::ft::vector<char,_ft::allocator<char>_>::vector
            ((vector<char,_ft::allocator<char>_> *)local_a8,
             (vector<char,_ft::allocator<char>_> *)local_1e8);
  print<std::stack<char,std::vector<char,std::allocator<char>>>>
            ((stack<char,_std::vector<char,_std::allocator<char>_>_> *)&ft.c.field_0x70,"std");
  print<ft::stack<char,ft::vector<char,ft::allocator<char>>>>
            ((stack<char,_ft::vector<char,_ft::allocator<char>_>_> *)local_a8,"ft");
  operator_delete((void *)local_a8);
  ::std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            ((_Vector_base<char,_std::allocator<char>_> *)&ft.c.field_0x70);
  operator_delete((void *)CONCAT71(local_1e8._1_7_,local_1e8[0]));
  ::std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            ((_Vector_base<char,_std::allocator<char>_> *)
             &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node);
  poVar1 = ::std::operator<<((ostream *)&::std::cout,"---");
  ::std::endl<char,std::char_traits<char>>(poVar1);
  ::std::stack<int,std::deque<int,std::allocator<int>>>::
  stack<std::deque<int,std::allocator<int>>,void>
            ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)&ft.c.field_0x70);
  ::std::stack<int,std::deque<int,std::allocator<int>>>::
  stack<std::deque<int,std::allocator<int>>,void>
            ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)local_240);
  ::ft::deque<int,_ft::allocator<int>_>::deque
            ((deque<int,_ft::allocator<int>_> *)local_a8,
             (allocator_type *)
             &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node);
  ::ft::deque<int,_ft::allocator<int>_>::deque
            ((deque<int,_ft::allocator<int>_> *)local_1e8,
             (deque<int,_ft::allocator<int>_> *)local_a8);
  ::ft::deque<int,_ft::allocator<int>_>::~deque((deque<int,_ft::allocator<int>_> *)local_a8);
  ::ft::deque<int,_ft::allocator<int>_>::deque
            ((deque<int,_ft::allocator<int>_> *)
             &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node,(allocator_type *)&ft_2.c.field_0x77);
  ::ft::deque<int,_ft::allocator<int>_>::deque
            ((deque<int,_ft::allocator<int>_> *)local_a8,
             (deque<int,_ft::allocator<int>_> *)
             &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node);
  ::ft::deque<int,_ft::allocator<int>_>::~deque
            ((deque<int,_ft::allocator<int>_> *)
             &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node);
  std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
  _M_node._0_4_ = 5;
  ::std::deque<int,_std::allocator<int>_>::emplace_back<int>
            ((deque<int,_std::allocator<int>_> *)&ft.c.field_0x70,
             (int *)&std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_node);
  std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
  _M_node._0_4_ = 5;
  ::std::deque<int,_std::allocator<int>_>::emplace_back<int>
            ((deque<int,_std::allocator<int>_> *)local_240,
             (int *)&std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_node);
  std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
  _M_node._0_4_ = 5;
  ::ft::deque<int,_ft::allocator<int>_>::push_back
            ((deque<int,_ft::allocator<int>_> *)local_1e8,
             (value_type *)
             &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node);
  std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
  _M_node._0_4_ = 5;
  ::ft::deque<int,_ft::allocator<int>_>::push_back
            ((deque<int,_ft::allocator<int>_> *)local_a8,
             (value_type *)
             &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node);
  std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
  _M_node._0_4_ = 0xb;
  ::std::deque<int,_std::allocator<int>_>::emplace_back<int>
            ((deque<int,_std::allocator<int>_> *)&ft.c.field_0x70,
             (int *)&std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_node);
  std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
  _M_node._0_4_ = 0xb;
  ::std::deque<int,_std::allocator<int>_>::emplace_back<int>
            ((deque<int,_std::allocator<int>_> *)local_240,
             (int *)&std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_node);
  std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
  _M_node._0_4_ = 0xb;
  ::ft::deque<int,_ft::allocator<int>_>::push_back
            ((deque<int,_ft::allocator<int>_> *)local_1e8,
             (value_type *)
             &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node);
  std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
  _M_node._0_4_ = 0xb;
  ::ft::deque<int,_ft::allocator<int>_>::push_back
            ((deque<int,_ft::allocator<int>_> *)local_a8,
             (value_type *)
             &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node);
  std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
  _M_node._0_4_ = 0x13;
  ::std::deque<int,_std::allocator<int>_>::emplace_back<int>
            ((deque<int,_std::allocator<int>_> *)&ft.c.field_0x70,
             (int *)&std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_node);
  std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
  _M_node._0_4_ = 0x13;
  ::std::deque<int,_std::allocator<int>_>::emplace_back<int>
            ((deque<int,_std::allocator<int>_> *)local_240,
             (int *)&std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_node);
  std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
  _M_node._0_4_ = 0x13;
  ::ft::deque<int,_ft::allocator<int>_>::push_back
            ((deque<int,_ft::allocator<int>_> *)local_1e8,
             (value_type *)
             &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node);
  std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
  _M_node._0_4_ = 0x13;
  ::ft::deque<int,_ft::allocator<int>_>::push_back
            ((deque<int,_ft::allocator<int>_> *)local_a8,
             (value_type *)
             &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node);
  relational_operator<std::stack<int,std::deque<int,std::allocator<int>>>>
            ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)&ft.c.field_0x70,"stdFoo",
             (stack<int,_std::deque<int,_std::allocator<int>_>_> *)local_240,"stdBar");
  relational_operator<ft::stack<int,ft::deque<int,ft::allocator<int>>>>
            ((stack<int,_ft::deque<int,_ft::allocator<int>_>_> *)local_1e8,"ftFoo",
             (stack<int,_ft::deque<int,_ft::allocator<int>_>_> *)local_a8,"ftBar");
  this = &ft.c.field_0x70;
  ::std::deque<int,_std::allocator<int>_>::pop_back((deque<int,_std::allocator<int>_> *)this);
  std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
  _M_node._0_4_ = 0x15;
  ::std::deque<int,_std::allocator<int>_>::emplace_back<int>
            ((deque<int,_std::allocator<int>_> *)this,
             (int *)&std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_node);
  ::ft::deque<int,_ft::allocator<int>_>::pop_back((deque<int,_ft::allocator<int>_> *)local_1e8);
  std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
  _M_node._0_4_ = 0x15;
  ::ft::deque<int,_ft::allocator<int>_>::push_back
            ((deque<int,_ft::allocator<int>_> *)local_1e8,
             (value_type *)
             &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node);
  relational_operator<std::stack<int,std::deque<int,std::allocator<int>>>>
            ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)&ft.c.field_0x70,"stdFoo",
             (stack<int,_std::deque<int,_std::allocator<int>_>_> *)local_240,"stdBar");
  relational_operator<ft::stack<int,ft::deque<int,ft::allocator<int>>>>
            ((stack<int,_ft::deque<int,_ft::allocator<int>_>_> *)local_1e8,"ftFoo",
             (stack<int,_ft::deque<int,_ft::allocator<int>_>_> *)local_a8,"ftBar");
  ::std::deque<int,_std::allocator<int>_>::pop_back((deque<int,_std::allocator<int>_> *)local_240);
  std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
  _M_node._0_4_ = 0x15;
  ::std::deque<int,_std::allocator<int>_>::emplace_back<int>
            ((deque<int,_std::allocator<int>_> *)local_240,
             (int *)&std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_node);
  std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
  _M_node._0_4_ = 3;
  ::std::deque<int,_std::allocator<int>_>::emplace_back<int>
            ((deque<int,_std::allocator<int>_> *)local_240,
             (int *)&std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_node);
  ::ft::deque<int,_ft::allocator<int>_>::pop_back((deque<int,_ft::allocator<int>_> *)local_a8);
  std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
  _M_node._0_4_ = 0x15;
  ::ft::deque<int,_ft::allocator<int>_>::push_back
            ((deque<int,_ft::allocator<int>_> *)local_a8,
             (value_type *)
             &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node);
  std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
  _M_node._0_4_ = 3;
  ::ft::deque<int,_ft::allocator<int>_>::push_back
            ((deque<int,_ft::allocator<int>_> *)local_a8,
             (value_type *)
             &std_2.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
              _M_finish._M_node);
  relational_operator<std::stack<int,std::deque<int,std::allocator<int>>>>
            ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)&ft.c.field_0x70,"stdFoo",
             (stack<int,_std::deque<int,_std::allocator<int>_>_> *)local_240,"stdBar");
  relational_operator<ft::stack<int,ft::deque<int,ft::allocator<int>>>>
            ((stack<int,_ft::deque<int,_ft::allocator<int>_>_> *)local_1e8,"ftFoo",
             (stack<int,_ft::deque<int,_ft::allocator<int>_>_> *)local_a8,"ftBar");
  ::ft::deque<int,_ft::allocator<int>_>::~deque((deque<int,_ft::allocator<int>_> *)local_a8);
  ::ft::deque<int,_ft::allocator<int>_>::~deque((deque<int,_ft::allocator<int>_> *)local_1e8);
  ::std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            ((_Deque_base<int,_std::allocator<int>_> *)local_240);
  ::std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            ((_Deque_base<int,_std::allocator<int>_> *)&ft.c.field_0x70);
  return 0;
}

Assistant:

int 	main() {
	{ // constructors and some basic functions
		std::stack<char>	std;
		ft::stack<char>		ft;

		if (std.empty()) std::cout << "std is empty" << std::endl;
		if (ft.empty()) std::cout << " ft is empty" << std::endl;

		std::cout << "size of std is: " << std.size() << std::endl;
		std::cout << "size of ft  is: " << ft.size() << std::endl;
	}

	std::cout << "---" << std::endl;

	{ // push pop and top
		std::stack<double>	std;
		ft::stack<double>	ft;

		for (int i = 1; i <= 7; ++i) {
			std.push(i / 3.0);
			ft.push(i / 3.0);
		}

		std::cout << "size of std is: " << std.size() << std::endl;
		std::cout << "size of ft  is: " << ft.size() << std::endl;

		PRINT(std);
		PRINT(ft);
	}

	std::cout << "---" << std::endl;

	{ // copy constructor
		std::stack<int>	stdCopy;
		ft::stack<int>	ftCopy;

		for (int i = 1; i <= 5; ++i) {
			stdCopy.push(i);
			ftCopy.push(i);
		}

		std::stack<int>	std(stdCopy);
		ft::stack<int>	ft(ftCopy);

		PRINT(std);
		PRINT(ft);
	}

	std::cout << "---" << std::endl;

	{ // assignment operator
		std::stack<std::string>	stdCopy;
		ft::stack<std::string>	ftCopy;

		stdCopy.push("what's");
		stdCopy.push("in");
		stdCopy.push("the");
		stdCopy.push("fucking");
		stdCopy.push("box");

		ftCopy.push("what's");
		ftCopy.push("in");
		ftCopy.push("the");
		ftCopy.push("fucking");
		ftCopy.push("box");

		std::stack<std::string>	std;
		ft::stack<std::string>	ft;

		std = stdCopy;
		ft = ftCopy;

		PRINT(std);
		PRINT(ft);
	}

	std::cout << "---" << std::endl;

	{ // different underlying container
		std::vector<char>	stdL(3, '~');
		ft::vector<char>	ftL(3, '~');

		std::stack<char, std::vector<char> >	std(stdL);
		ft::stack<char, ft::vector<char> >		ft(ftL);

		PRINT(std);
		PRINT(ft);
	}

	std::cout << "---" << std::endl;

	{ // relational operators
		std::stack<int>	stdFoo, stdBar;
		ft::stack<int>	ftFoo, ftBar;

		stdFoo.push(5);
		stdBar.push(5);
		ftFoo.push(5);
		ftBar.push(5);

		stdFoo.push(11);
		stdBar.push(11);
		ftFoo.push(11);
		ftBar.push(11);

		stdFoo.push(19);
		stdBar.push(19);
		ftFoo.push(19);
		ftBar.push(19);

		COMP(stdFoo, stdBar);
		COMP(ftFoo, ftBar);

		stdFoo.pop();
		stdFoo.push(21);
		ftFoo.pop();
		ftFoo.push(21);

		COMP(stdFoo, stdBar);
		COMP(ftFoo, ftBar);

		stdBar.pop();
		stdBar.push(21);
		stdBar.push(3);
		ftBar.pop();
		ftBar.push(21);
		ftBar.push(3);

		COMP(stdFoo, stdBar);
		COMP(ftFoo, ftBar);
	}
	return 0;
}